

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SDL12_compat.c
# Opt level: O3

char * SDL_AudioDriverName(char *namebuf,int maxlen)

{
  char *pcVar1;
  
  pcVar1 = (*SDL20_GetCurrentAudioDriver)();
  if (pcVar1 == (char *)0x0) {
    pcVar1 = (char *)0x0;
  }
  else if (namebuf != (char *)0x0) {
    (*SDL20_strlcpy)(namebuf,pcVar1,(long)maxlen);
    pcVar1 = namebuf;
  }
  return pcVar1;
}

Assistant:

DECLSPEC12 const char * SDLCALL
SDL_AudioDriverName(char *namebuf, int maxlen)
{
    return GetDriverName(SDL20_GetCurrentAudioDriver(), namebuf, maxlen);
}